

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O1

word If_Dec6Truth(word z)

{
  uint uVar1;
  word wVar2;
  long lVar3;
  uint uVar4;
  word wVar5;
  word f [4];
  word awStack_98 [8];
  word awStack_58 [3];
  code *pcStack_40;
  word local_38 [5];
  
  if (z == 0) {
    pcStack_40 = If_Dec6ComposeLut4;
    __assert_fail("z",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                  ,0x7a,"word If_Dec6Truth(word)");
  }
  lVar3 = 0x10;
  do {
    uVar1 = (uint)(z >> ((byte)lVar3 & 0x3f));
    uVar4 = uVar1 & 7;
    if (uVar4 != 6) {
      if (uVar4 == 7) {
        pcStack_40 = (code *)0x412144;
        __assert_fail("v != 7",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                      ,0x7e,"word If_Dec6Truth(word)");
      }
      *(word *)((long)awStack_58 + lVar3 * 2) = Truth6[uVar1 & 7];
    }
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x20);
  pcStack_40 = (code *)0x4120db;
  wVar2 = If_Dec6ComposeLut4((uint)z & 0xffff,local_38);
  lVar3 = 0x30;
  do {
    uVar1 = (uint)(z >> ((byte)lVar3 & 0x3f));
    uVar4 = uVar1 & 7;
    if (uVar4 != 6) {
      wVar5 = wVar2;
      if (uVar4 != 7) {
        wVar5 = Truth6[uVar1 & 7];
      }
      *(word *)((long)awStack_98 + lVar3 * 2) = wVar5;
    }
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x40);
  pcStack_40 = (code *)0x41211d;
  wVar2 = If_Dec6ComposeLut4((uint)(z >> 0x20) & 0xffff,local_38);
  return wVar2;
}

Assistant:

word If_Dec6Truth( word z )
{
    word r, q, f[4];
    int i, v;
    assert( z );
    for ( i = 0; i < 4; i++ )
    {
        v = (z >> (16+(i<<2))) & 7;
        assert( v != 7 );
        if ( v == 6 )
            continue;
        f[i] = Truth6[v];
    }
    q = If_Dec6ComposeLut4( (int)(z & 0xffff), f );
    for ( i = 0; i < 4; i++ )
    {
        v = (z >> (48+(i<<2))) & 7;
        if ( v == 6 )
            continue;
        f[i] = (v == 7) ? q : Truth6[v];
    }
    r = If_Dec6ComposeLut4( (int)((z >> 32) & 0xffff), f );
    return r;
}